

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

int uv__work_cancel(uv_loop_t *loop,uv_req_t *req,uv__work *w)

{
  bool bVar1;
  int cancelled;
  uv__work *w_local;
  uv_req_t *req_local;
  uv_loop_t *loop_local;
  
  uv_mutex_lock(&mutex);
  uv_mutex_lock(&w->loop->wq_mutex);
  bVar1 = false;
  if (w->wq != (void **)w->wq[0]) {
    bVar1 = w->work != (_func_void_uv__work_ptr *)0x0;
  }
  if (bVar1) {
    *(void **)w->wq[1] = w->wq[0];
    *(void **)((long)w->wq[0] + 8) = w->wq[1];
  }
  uv_mutex_unlock(&w->loop->wq_mutex);
  uv_mutex_unlock(&mutex);
  if (bVar1) {
    w->work = uv__cancelled;
    uv_mutex_lock(&loop->wq_mutex);
    w->wq[0] = loop->wq;
    w->wq[1] = loop->wq[1];
    *(void ***)w->wq[1] = w->wq;
    loop->wq[1] = w->wq;
    uv_async_send(&loop->wq_async);
    uv_mutex_unlock(&loop->wq_mutex);
    loop_local._4_4_ = 0;
  }
  else {
    loop_local._4_4_ = -0x10;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__work_cancel(uv_loop_t* loop, uv_req_t* req, struct uv__work* w) {
  int cancelled;

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&w->loop->wq_mutex);

  cancelled = !QUEUE_EMPTY(&w->wq) && w->work != NULL;
  if (cancelled)
    QUEUE_REMOVE(&w->wq);

  uv_mutex_unlock(&w->loop->wq_mutex);
  uv_mutex_unlock(&mutex);

  if (!cancelled)
    return UV_EBUSY;

  w->work = uv__cancelled;
  uv_mutex_lock(&loop->wq_mutex);
  QUEUE_INSERT_TAIL(&loop->wq, &w->wq);
  uv_async_send(&loop->wq_async);
  uv_mutex_unlock(&loop->wq_mutex);

  return 0;
}